

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O3

void __thiscall Assimp::LWO::Surface::Surface(Surface *this)

{
  (this->mName)._M_dataplus._M_p = (pointer)&(this->mName).field_2;
  (this->mName)._M_string_length = 0;
  (this->mName).field_2._M_local_buf[0] = '\0';
  (this->mColor).r = 0.78431;
  (this->mColor).g = 0.78431;
  (this->mColor).b = 0.78431;
  this->bDoubleSided = false;
  this->mDiffuseValue = 1.0;
  this->mSpecularValue = 0.0;
  this->mTransparency = 0.0;
  this->mGlossiness = 0.4;
  this->mLuminosity = 0.0;
  this->mColorHighlights = 0.0;
  this->mMaximumSmoothAngle = 0.0;
  (this->mVCMap)._M_dataplus._M_p = (pointer)&(this->mVCMap).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->mVCMap,"");
  this->mVCMapType = 0x52474241;
  (this->mShaders).super__List_base<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->mShaders;
  (this->mShaders).super__List_base<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->mShaders;
  (this->mShaders).super__List_base<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_>.
  _M_impl._M_node._M_size = 0;
  (this->mColorTextures).
  super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->mColorTextures;
  (this->mColorTextures).
  super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->mColorTextures;
  (this->mColorTextures).
  super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl._M_node.
  _M_size = 0;
  (this->mDiffuseTextures).
  super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->mDiffuseTextures;
  (this->mDiffuseTextures).
  super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->mDiffuseTextures;
  (this->mDiffuseTextures).
  super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl._M_node.
  _M_size = 0;
  (this->mSpecularTextures).
  super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->mSpecularTextures;
  (this->mSpecularTextures).
  super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->mSpecularTextures;
  (this->mSpecularTextures).
  super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl._M_node.
  _M_size = 0;
  (this->mOpacityTextures).
  super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->mOpacityTextures;
  (this->mOpacityTextures).
  super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->mOpacityTextures;
  (this->mOpacityTextures).
  super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl._M_node.
  _M_size = 0;
  (this->mBumpTextures).
  super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->mBumpTextures;
  (this->mBumpTextures).
  super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->mBumpTextures;
  (this->mBumpTextures).
  super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl._M_node.
  _M_size = 0;
  (this->mGlossinessTextures).
  super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->mGlossinessTextures;
  (this->mGlossinessTextures).
  super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->mGlossinessTextures;
  (this->mGlossinessTextures).
  super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl._M_node.
  _M_size = 0;
  (this->mReflectionTextures).
  super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->mReflectionTextures;
  (this->mReflectionTextures).
  super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->mReflectionTextures;
  (this->mReflectionTextures).
  super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>._M_impl._M_node.
  _M_size = 0;
  this->mIOR = 1.0;
  this->mBumpIntensity = 1.0;
  this->mWireframe = false;
  this->mAdditiveTransparency = 0.0;
  return;
}

Assistant:

Surface()
        : mColor                (0.78431f,0.78431f,0.78431f)
        , bDoubleSided          (false)
        , mDiffuseValue         (1.f)
        , mSpecularValue        (0.f)
        , mTransparency         (0.f)
        , mGlossiness           (0.4f)
        , mLuminosity           (0.f)
        , mColorHighlights      (0.f)
        , mMaximumSmoothAngle   (0.f) // 0 == not specified, no smoothing
        , mVCMap                ("")
        , mVCMapType            (AI_LWO_RGBA)
        , mIOR                  (1.f) // vakuum
        , mBumpIntensity        (1.f)
        , mWireframe            (false)
        , mAdditiveTransparency (0.f)
    {}